

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

void __thiscall aalcalc::debug_process_summaryfile(aalcalc *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  mapped_type *pmVar6;
  DIR *__dirp;
  dirent *pdVar7;
  undefined8 extraout_RAX;
  char *__rhs;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int summary_set;
  sampleslevelRec sr;
  summarySampleslevelHeader sh;
  int summarycalcstream_type;
  string sStack_120;
  undefined1 auStack_100 [40];
  undefined1 *puStack_d8;
  undefined1 auStack_c8 [16];
  _Base_ptr ap_Stack_b8 [4];
  undefined4 local_5c;
  uint local_58;
  float local_54;
  FILE *local_50;
  double local_48;
  _Rb_tree_color local_40;
  uint local_3c;
  uint local_34;
  
  __rhs = "rb";
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    debug_process_summaryfile((aalcalc *)filename);
  }
  else {
    local_34 = 0;
    __rhs = (char *)0x4;
    fread(&local_34,4,1,__stream);
    filename = (string *)(ulong)(local_34 & 0x3000000);
    if ((local_34 & 0x3000000) == 0x3000000) {
      if ((local_34 & 0xffffff) == 1) {
        local_5c = 0;
        sVar5 = fread(&this->samplesize_,4,1,__stream);
        if (sVar5 == 0) {
          puts("event_id,period_no,summary_id,sidx,loss");
        }
        else {
          sVar5 = fread(&local_5c,4,1,__stream);
          puts("event_id,period_no,summary_id,sidx,loss");
          if (sVar5 != 0) {
            this_00 = &this->event_to_period_;
            local_50 = __stream;
            do {
              sVar5 = fread(&local_40,0xc,1,__stream);
              bVar10 = sVar5 == 0;
              do {
                bVar9 = bVar10;
                if (bVar9) break;
                sVar5 = fread(&local_58,8,1,__stream);
                uVar3 = local_58;
                bVar8 = local_58 != 0;
                if (!bVar8 || sVar5 == 0) {
                  bVar9 = sVar5 == 0;
                  break;
                }
                pmVar6 = std::
                         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[](this_00,(key_type *)&local_40);
                puVar2 = (uint *)(pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start;
                pmVar6 = std::
                         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[](this_00,(key_type *)&local_40);
                if (puVar2 != (uint *)(pmVar6->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish) {
                  local_48 = (double)local_54;
                  do {
                    printf("%d,%d,%d,%d,%f\n",local_48,(ulong)local_40,(ulong)*puVar2,
                           (ulong)local_3c,(ulong)uVar3);
                    pmVar6 = std::
                             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                             ::operator[](this_00,(key_type *)&local_40);
                  } while (puVar2 != (uint *)(pmVar6->super__Vector_base<int,_std::allocator<int>_>)
                                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                __stream = local_50;
                bVar10 = false;
              } while (bVar8 && sVar5 != 0);
            } while (!bVar9);
          }
        }
      }
      fclose(__stream);
      return;
    }
  }
  debug_process_summaryfile((aalcalc *)filename);
  auStack_100._32_8_ = filename;
  loadoccurrence((aalcalc *)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_100,
                 "work/",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
  ;
  std::__cxx11::string::substr((ulong)&sStack_120,(ulong)auStack_100);
  iVar4 = std::__cxx11::string::compare((char *)&sStack_120);
  paVar1 = &sStack_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_120._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_120._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    sStack_120._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_120,auStack_100._0_8_,
               (char *)(auStack_100._0_8_ + auStack_100._8_8_));
    std::__cxx11::string::append((char *)&sStack_120);
    std::__cxx11::string::operator=((string *)auStack_100,(string *)&sStack_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_120._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_120._M_dataplus._M_p);
    }
  }
  __dirp = opendir((char *)auStack_100._0_8_);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar7 = readdir(__dirp);
      if (pdVar7 == (dirent *)0x0) break;
      sStack_120._M_dataplus._M_p = (pointer)&sStack_120.field_2;
      sVar5 = strlen(pdVar7->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sStack_120,pdVar7->d_name,pdVar7->d_name + sVar5);
      if (sStack_120._M_string_length < 5) {
        bVar10 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)ap_Stack_b8,(ulong)&sStack_120);
        iVar4 = std::__cxx11::string::compare((char *)ap_Stack_b8);
        bVar10 = iVar4 == 0;
        if (ap_Stack_b8[0] != (_Base_ptr)(ap_Stack_b8 + 2)) {
          operator_delete(ap_Stack_b8[0]);
        }
      }
      if (bVar10) {
        puStack_d8 = auStack_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&puStack_d8,auStack_100._0_8_,
                   (char *)(auStack_100._0_8_ + auStack_100._8_8_));
        std::__cxx11::string::append((char *)&puStack_d8);
        std::__cxx11::string::operator=((string *)&sStack_120,(string *)&puStack_d8);
        if (puStack_d8 != auStack_c8) {
          operator_delete(puStack_d8);
        }
        debug_process_summaryfile((aalcalc *)auStack_100._32_8_,&sStack_120);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_120._M_dataplus._M_p != &sStack_120.field_2) {
        operator_delete(sStack_120._M_dataplus._M_p);
      }
    }
    if ((undefined1 *)auStack_100._0_8_ != auStack_100 + 0x10) {
      operator_delete((void *)auStack_100._0_8_);
    }
    return;
  }
  debug((aalcalc *)auStack_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_120._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_120._M_dataplus._M_p);
  }
  if ((undefined1 *)auStack_100._0_8_ != auStack_100 + 0x10) {
    operator_delete((void *)auStack_100._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void aalcalc::debug_process_summaryfile(const std::string &filename)
{
	FILE *fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		fprintf(stderr, "FATAL:%s: Not a summarycalc stream type %d\n", __func__, stream_type);
		exit(-1);
	}
	stream_type = streamno_mask & summarycalcstream_type;

	if (stream_type == 1) {
		int summary_set = 0;
		i = fread(&samplesize_, sizeof(samplesize_), 1, fin);
		if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
		printf("event_id,period_no,summary_id,sidx,loss\n");
		summarySampleslevelHeader sh;
		int j = 0;
		while (i != 0) {
			i = fread(&sh, sizeof(sh), 1, fin);
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, fin);
				if (i == 0) break;
				if (sr.sidx == 0) break;
				auto p_iter = event_to_period_[sh.event_id].begin();
				while (p_iter != event_to_period_[sh.event_id].end()) {
					printf("%d,%d,%d,%d,%f\n", sh.event_id, *p_iter, sh.summary_id, sr.sidx, sr.loss);
				}

			}
			j++;
		}		
	}

	fclose(fin);
}